

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O0

int Intp_ManEnqueue(Intp_Man_t *p,lit Lit,Sto_Cls_t *pReason)

{
  int iVar1;
  int Var;
  Sto_Cls_t *pReason_local;
  lit Lit_local;
  Intp_Man_t *p_local;
  
  iVar1 = lit_var(Lit);
  if (p->pAssigns[iVar1] == -1) {
    p->pAssigns[iVar1] = Lit;
    p->pReasons[iVar1] = pReason;
    iVar1 = p->nTrailSize;
    p->nTrailSize = iVar1 + 1;
    p->pTrail[iVar1] = Lit;
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = (uint)(p->pAssigns[iVar1] == Lit);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Intp_ManEnqueue( Intp_Man_t * p, lit Lit, Sto_Cls_t * pReason )
{
    int Var = lit_var(Lit);
    if ( p->pAssigns[Var] != LIT_UNDEF )
        return p->pAssigns[Var] == Lit;
    p->pAssigns[Var] = Lit;
    p->pReasons[Var] = pReason;
    p->pTrail[p->nTrailSize++] = Lit;
//printf( "assigning var %d value %d\n", Var, !lit_sign(Lit) );
    return 1;
}